

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

bool anon_unknown.dwarf_9b6ee2::needToQuoteTestName(cmMakefile *mf,string *name)

{
  PolicyStatus PVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 auVar3 [12];
  string local_98;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  undefined8 local_48;
  char *local_40;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  char *local_20;
  
  bVar2 = false;
  PVar1 = cmMakefile::GetPolicyStatus(mf,CMP0110,false);
  if (PVar1 != OLD) {
    if (PVar1 == WARN) {
      bVar2 = false;
      auVar3 = std::__cxx11::string::find_first_of((char *)name,0x6ea07b,0);
      if (auVar3._0_8_ != -1) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_78,(cmPolicies *)0x6e,auVar3._8_4_);
        local_58._M_len = local_78._M_string_length;
        local_58._M_str = local_78._M_dataplus._M_p;
        local_48 = 0x5b;
        local_40 = 
        "\nThe following name given to add_test() is invalid if CMP0110 is not set or set to OLD:\n  `"
        ;
        local_30 = (name->_M_dataplus)._M_p;
        local_38 = name->_M_string_length;
        local_28 = 3;
        local_20 = anon_var_dwarf_9b1501;
        views._M_len = 4;
        views._M_array = &local_58;
        cmCatViews_abi_cxx11_(&local_98,views);
        cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        bVar2 = false;
      }
    }
    else {
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool needToQuoteTestName(const cmMakefile& mf, const std::string& name)
{
  // Determine if policy CMP0110 is set to NEW.
  switch (mf.GetPolicyStatus(cmPolicies::CMP0110)) {
    case cmPolicies::WARN:
      // Only warn if a forbidden character is used in the name.
      if (name.find_first_of("$[] #;\t\n\"\\") != std::string::npos) {
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0110),
                   "\nThe following name given to add_test() is invalid if "
                   "CMP0110 is not set or set to OLD:\n  `",
                   name, "´\n"));
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to not quote the test's name.
      return false;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
    default:
      // NEW behavior is to quote the test's name.
      return true;
  }
}